

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::FindFileByName
          (SourceTreeDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  MultiFileErrorCollector *pMVar1;
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  pointer input_00;
  uint32_t *puVar5;
  Arena *pAVar6;
  byte local_22a;
  undefined1 local_1e8 [8];
  Parser parser;
  Tokenizer tokenizer;
  SingleFileErrorCollector file_error_collector;
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  local_40;
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  input;
  FileDescriptorProto *output_local;
  string *filename_local;
  SourceTreeDescriptorDatabase *this_local;
  
  input._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>,_true,_true>
          )output;
  iVar3 = (*this->source_tree_->_vptr_SourceTree[2])(this->source_tree_,filename);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,std::default_delete<google::protobuf::io::ZeroCopyInputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyInputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyInputStream,std::default_delete<google::protobuf::io::ZeroCopyInputStream>>
              *)&local_40,(pointer)CONCAT44(extraout_var,iVar3));
  bVar2 = std::operator==(&local_40,(nullptr_t)0x0);
  if (bVar2) {
    if ((this->fallback_database_ == (DescriptorDatabase *)0x0) ||
       (uVar4 = (*this->fallback_database_->_vptr_DescriptorDatabase[2])
                          (this->fallback_database_,filename,
                           input._M_t.
                           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                           .
                           super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>
                           ._M_head_impl), (uVar4 & 1) == 0)) {
      if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
        pMVar1 = this->error_collector_;
        (*this->source_tree_->_vptr_SourceTree[3])(&file_error_collector.had_errors_);
        (*pMVar1->_vptr_MultiFileErrorCollector[2])
                  (pMVar1,filename,0xffffffff,0,&file_error_collector.had_errors_);
        std::__cxx11::string::~string((string *)&file_error_collector.had_errors_);
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    SingleFileErrorCollector::SingleFileErrorCollector
              ((SingleFileErrorCollector *)&tokenizer.comment_style_,filename,this->error_collector_
              );
    input_00 = std::
               unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
               ::get(&local_40);
    io::Tokenizer::Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,input_00,
               (ErrorCollector *)&tokenizer.comment_style_);
    Parser::Parser((Parser *)local_1e8);
    if (this->error_collector_ != (MultiFileErrorCollector *)0x0) {
      Parser::RecordErrorsTo((Parser *)local_1e8,(ErrorCollector *)&tokenizer.comment_style_);
    }
    if ((this->using_validation_error_collector_ & 1U) != 0) {
      Parser::RecordSourceLocationsTo((Parser *)local_1e8,&this->source_locations_);
    }
    this_00._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
         input._M_t.
         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
    puVar5 = internal::HasBits<1UL>::operator[]
                       ((HasBits<1UL> *)
                        ((long)input._M_t.
                               super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                               .
                               super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>
                               ._M_head_impl + 0x10),0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    pAVar6 = MessageLite::GetArenaForAllocation
                       ((MessageLite *)
                        this_00._M_t.
                        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>.
                        _M_head_impl);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               ((long)this_00._M_t.
                      super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                      .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>.
                      _M_head_impl + 0xb0),filename,pAVar6);
    bVar2 = Parser::Parse((Parser *)local_1e8,
                          (Tokenizer *)
                          &parser.upcoming_detached_comments_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (FileDescriptorProto *)
                          input._M_t.
                          super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                          .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>
                          ._M_head_impl);
    local_22a = 0;
    if (bVar2) {
      bVar2 = SingleFileErrorCollector::had_errors
                        ((SingleFileErrorCollector *)&tokenizer.comment_style_);
      local_22a = bVar2 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_22a & 1);
    Parser::~Parser((Parser *)local_1e8);
    io::Tokenizer::~Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SingleFileErrorCollector::~SingleFileErrorCollector
              ((SingleFileErrorCollector *)&tokenizer.comment_style_);
  }
  std::
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ::~unique_ptr(&local_40);
  return this_local._7_1_;
}

Assistant:

bool SourceTreeDescriptorDatabase::FindFileByName(const std::string& filename,
                                                  FileDescriptorProto* output) {
  std::unique_ptr<io::ZeroCopyInputStream> input(source_tree_->Open(filename));
  if (input == NULL) {
    if (fallback_database_ != nullptr &&
        fallback_database_->FindFileByName(filename, output)) {
      return true;
    }
    if (error_collector_ != NULL) {
      error_collector_->AddError(filename, -1, 0,
                                 source_tree_->GetLastErrorMessage());
    }
    return false;
  }

  // Set up the tokenizer and parser.
  SingleFileErrorCollector file_error_collector(filename, error_collector_);
  io::Tokenizer tokenizer(input.get(), &file_error_collector);

  Parser parser;
  if (error_collector_ != NULL) {
    parser.RecordErrorsTo(&file_error_collector);
  }
  if (using_validation_error_collector_) {
    parser.RecordSourceLocationsTo(&source_locations_);
  }

  // Parse it.
  output->set_name(filename);
  return parser.Parse(&tokenizer, output) && !file_error_collector.had_errors();
}